

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  int iVar1;
  ThreadLocalValueHolderBase *base;
  ValueHolder *pVVar2;
  undefined8 *__pointer;
  TestPartResultReporterInterface **ppTVar3;
  GTestLog local_1c;
  
  base = (ThreadLocalValueHolderBase *)pthread_getspecific(this->key_);
  if (base == (ThreadLocalValueHolderBase *)0x0) {
    __pointer = (undefined8 *)operator_new(0x10);
    *__pointer = &PTR__ThreadLocalValueHolderBase_00194d68;
    ppTVar3 = (TestPartResultReporterInterface **)(__pointer + 1);
    __pointer[1] = this->default_;
    iVar1 = pthread_setspecific(this->key_,__pointer);
    if (iVar1 != 0) {
      GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/deps/gtest/include/gtest/internal/gtest-port.h"
                         ,0x570);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"pthread_setspecific(key_, holder_base)",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed with error ",0x12);
      std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      GTestLog::~GTestLog(&local_1c);
    }
  }
  else {
    pVVar2 = CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                       (base);
    ppTVar3 = &pVVar2->value_;
  }
  return ppTVar3;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != NULL) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = new ValueHolder(default_);
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }